

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLocalGet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Index local)

{
  LocalGet *expr;
  Ok local_61;
  uintptr_t local_60;
  allocator<char> local_41;
  Err local_40;
  Index local_1c;
  IRBuilder *pIStack_18;
  Index local_local;
  IRBuilder *this_local;
  
  local_1c = local;
  pIStack_18 = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"local.get is only valid in a function context",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    local_60 = (uintptr_t)Function::getLocalType(this->func,local);
    expr = Builder::makeLocalGet(&this->builder,local,(Type)local_60);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLocalGet(Index local) {
  if (!func) {
    return Err{"local.get is only valid in a function context"};
  }
  push(builder.makeLocalGet(local, func->getLocalType(local)));
  return Ok{};
}